

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_net.c
# Opt level: O1

void sockaddr_set_port(sockaddr *sa,uint port)

{
  if ((sa->sa_family | 8) == 10) {
    *(ushort *)sa->sa_data = (ushort)port << 8 | (ushort)port >> 8;
  }
  return;
}

Assistant:

void sockaddr_set_port(const struct sockaddr *sa, unsigned int port) {
    if (sa->sa_family == AF_INET6)
    {
        struct sockaddr_in6 *sa6 = (struct sockaddr_in6 *)sa;
        sa6->sin6_port = htons(port);
    }
    else if (sa->sa_family == AF_INET)
    {
        struct sockaddr_in *sa4 = (struct sockaddr_in *)sa;
        sa4->sin_port = htons(port);
    }
}